

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall IVmBifTadsRNG::put_state(IVmBifTadsRNG *this,vm_val_t *val)

{
  CVmObjPageEntry *pCVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  uchar *buf;
  undefined8 *puVar6;
  long *plVar7;
  ulong uVar8;
  err_frame_t err_cur__;
  ulong len;
  
  iVar4 = (*this->_vptr_IVmBifTadsRNG[6])();
  len = CONCAT44(extraout_var,iVar4);
  if (len == 0) {
    uVar5 = vm_val_t::num_to_int(val);
    (*this->_vptr_IVmBifTadsRNG[8])(this,(ulong)uVar5);
  }
  else {
    uVar8 = (ulong)(val->val).obj & 0xfff;
    (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar8].ptr_ + 8))
              (G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar8,CVmObjByteArray::metaclass_reg_);
    pCVar1 = G_obj_table_X.pages_[(val->val).obj >> 0xc];
    uVar8 = (ulong)(val->val).obj & 0xfff;
    if (len != **(uint **)((long)&pCVar1[uVar8].ptr_ + 8)) {
      err_throw(0x902);
    }
    buf = (uchar *)operator_new__(len);
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar6;
    plVar7 = (long *)_ZTW11G_err_frame();
    *plVar7 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      CVmObjByteArray::copy_to_buf((CVmObjByteArray *)(pCVar1 + uVar8),buf,1,len);
      (*this->_vptr_IVmBifTadsRNG[10])(this,buf);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      operator_delete__(buf);
    }
    peVar2 = err_cur__.prv_;
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    *puVar6 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar6 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar6 & 2) != 0) {
        plVar7 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar7 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar7 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar7 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
  }
  return;
}

Assistant:

void put_state(VMG_ vm_val_t *val)
    {
        /* determine what to do based on the state length */
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            put_state_int(val->num_to_int(vmg0_));
        }
        else
        {
            /* retrieve the ByteArray object */
            CVmObjByteArray *barr = vm_val_cast(CVmObjByteArray, val);

            /* check that it matches the expected state buffer size */
            unsigned long cnt = barr->get_element_count();
            if (cnt != len)
                err_throw(VMERR_BAD_VAL_BIF);

            /* retrieve the bytes and restore the state */
            char *buf = new char[len];
            err_try
            {
                /* retrieve the bytes */
                barr->copy_to_buf((unsigned char *)buf, 1, len);

                /* restore the state */
                put_state_buf(buf);
            }
            err_finally
            {
                delete [] buf;
            }